

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<tinyusdz::value::matrix2d> *value)

{
  bool bVar1;
  undefined1 local_48 [8];
  matrix2d v;
  optional<tinyusdz::value::matrix2d> *value_local;
  AsciiParser *this_local;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    nonstd::optional_lite::optional<tinyusdz::value::matrix2d>::operator=(value);
    this_local._7_1_ = true;
  }
  else {
    tinyusdz::value::matrix2d::matrix2d((matrix2d *)local_48);
    bVar1 = ReadBasicType(this,(matrix2d *)local_48);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::matrix2d>::operator=
                (value,(matrix2d *)local_48);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::matrix2d> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::matrix2d v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}